

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

Offset<reflection::Object> __thiscall
flatbuffers::StructDef::Serialize(StructDef *this,FlatBufferBuilder *builder,Parser *parser)

{
  FieldDef *this_00;
  string_view str;
  bool bVar1;
  Offset<flatbuffers::String> name;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>_> fields;
  Offset<flatbuffers::String> declaration_file;
  Offset<reflection::Object> OVar2;
  reference ppFVar3;
  difference_type dVar4;
  allocator<char> local_c9;
  Offset<flatbuffers::String> file__;
  string decl_file_in_project;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> docs__;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attr__;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>_> flds__;
  Offset<flatbuffers::String> name__;
  string qualified_name;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_68;
  value_type local_5c;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_58;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_50;
  const_iterator it;
  vector<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
  field_offsets;
  Parser *parser_local;
  FlatBufferBuilder *builder_local;
  StructDef *this_local;
  
  std::
  vector<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
  ::vector((vector<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
            *)&it);
  local_50._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(this->fields).vec);
  while( true ) {
    local_58._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                   (&(this->fields).vec);
    bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_50);
    this_00 = *ppFVar3;
    local_68._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   (&(this->fields).vec);
    dVar4 = __gnu_cxx::operator-(&local_50,&local_68);
    local_5c.o = (offset_type)FieldDef::Serialize(this_00,builder,(uint16_t)dVar4,parser);
    std::
    vector<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
    ::push_back((vector<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
                 *)&it,&local_5c);
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_50);
  }
  Namespace::GetFullyQualifiedName
            ((string *)&flds__,(this->super_Definition).defined_namespace,(string *)this,1000);
  name = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(builder,(string *)&flds__);
  fields = FlatBufferBuilderImpl<false>::
           CreateVectorOfSortedTables<reflection::Field,std::allocator<flatbuffers::Offset<reflection::Field>>>
                     (builder,(vector<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
                               *)&it);
  decl_file_in_project.field_2._12_4_ =
       Definition::SerializeAttributes(&this->super_Definition,builder,parser);
  if ((((parser->opts).binary_schema_comments & 1U) == 0) ||
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&(this->super_Definition).doc_comment), bVar1)) {
    Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>::Offset
              ((Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
                *)((long)&decl_file_in_project.field_2 + 8),0);
  }
  else {
    decl_file_in_project.field_2._8_4_ =
         FlatBufferBuilderImpl<false>::
         CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                   (builder,&(this->super_Definition).doc_comment);
  }
  if ((this->super_Definition).declaration_file == (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&file__,"",&local_c9);
    std::allocator<char>::~allocator(&local_c9);
  }
  else {
    std::__cxx11::string::string
              ((string *)&file__,(string *)(this->super_Definition).declaration_file);
  }
  str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&file__);
  declaration_file = FlatBufferBuilderImpl<false>::CreateSharedString(builder,str);
  OVar2 = reflection::CreateObject
                    (builder,name,fields,(bool)(this->fixed & 1),(int32_t)this->minalign,
                     (int32_t)this->bytesize,
                     (Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
                      )decl_file_in_project.field_2._12_4_,
                     (Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
                      )decl_file_in_project.field_2._8_4_,declaration_file);
  std::__cxx11::string::~string((string *)&file__);
  std::__cxx11::string::~string((string *)&flds__);
  std::
  vector<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
  ::~vector((vector<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
             *)&it);
  return (Offset<reflection::Object>)OVar2.o;
}

Assistant:

Offset<reflection::Object> StructDef::Serialize(FlatBufferBuilder *builder,
                                                const Parser &parser) const {
  std::vector<Offset<reflection::Field>> field_offsets;
  for (auto it = fields.vec.begin(); it != fields.vec.end(); ++it) {
    field_offsets.push_back((*it)->Serialize(
        builder, static_cast<uint16_t>(it - fields.vec.begin()), parser));
  }
  const auto qualified_name = defined_namespace->GetFullyQualifiedName(name);
  const auto name__ = builder->CreateString(qualified_name);
  const auto flds__ = builder->CreateVectorOfSortedTables(&field_offsets);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  std::string decl_file_in_project = declaration_file ? *declaration_file : "";
  const auto file__ = builder->CreateSharedString(decl_file_in_project);
  return reflection::CreateObject(
      *builder, name__, flds__, fixed, static_cast<int>(minalign),
      static_cast<int>(bytesize), attr__, docs__, file__);
}